

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O3

int run_test_pipe_getsockname_abstract(void)

{
  uint __fd;
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_pipe_t *loop;
  size_t len;
  sockaddr_un sun;
  char buf [1024];
  size_t local_490;
  undefined1 local_486 [20];
  undefined8 uStack_472;
  undefined8 local_46a;
  undefined8 uStack_462;
  undefined8 local_45a;
  undefined8 uStack_452;
  undefined8 local_44a;
  undefined8 uStack_442;
  undefined8 local_43a;
  undefined8 uStack_432;
  undefined8 local_42a;
  undefined8 uStack_422;
  undefined2 local_41a;
  undefined3 local_418;
  undefined5 uStack_415;
  undefined3 uStack_410;
  
  loop = (uv_pipe_t *)0x1;
  __fd = socket(1,1,0);
  if (__fd == 0xffffffff) {
    run_test_pipe_getsockname_abstract_cold_8();
LAB_0016330e:
    run_test_pipe_getsockname_abstract_cold_1();
LAB_00163313:
    run_test_pipe_getsockname_abstract_cold_2();
LAB_00163318:
    run_test_pipe_getsockname_abstract_cold_3();
LAB_0016331d:
    run_test_pipe_getsockname_abstract_cold_4();
LAB_00163322:
    run_test_pipe_getsockname_abstract_cold_5();
  }
  else {
    local_486._13_7_ = 0;
    uStack_472 = 0;
    local_42a = 0;
    uStack_422 = 0;
    local_43a = 0;
    uStack_432 = 0;
    local_44a = 0;
    uStack_442 = 0;
    local_45a = 0;
    uStack_452 = 0;
    local_46a = 0;
    uStack_462 = 0;
    local_41a = 0;
    local_486._0_2_ = 1;
    local_486[2] = '\0';
    local_486[3] = 't';
    local_486[4] = 'e';
    local_486[5] = 's';
    local_486[6] = 't';
    local_486[7] = '-';
    local_486[8] = 'p';
    local_486[9] = 'i';
    local_486[10] = 'p';
    local_486[0xb] = 'e';
    local_486[0xc] = '\0';
    loop = (uv_pipe_t *)(ulong)__fd;
    iVar1 = bind(__fd,(sockaddr *)local_486,0x6e);
    if (iVar1 != 0) goto LAB_0016330e;
    loop = (uv_pipe_t *)uv_default_loop();
    iVar1 = uv_pipe_init((uv_loop_t *)loop,&pipe_server,0);
    if (iVar1 != 0) goto LAB_00163313;
    loop = &pipe_server;
    iVar1 = uv_pipe_open(&pipe_server,__fd);
    if (iVar1 != 0) goto LAB_00163318;
    local_490 = 0x400;
    loop = &pipe_server;
    iVar1 = uv_pipe_getsockname(&pipe_server,(char *)&local_418,&local_490);
    if (iVar1 != 0) goto LAB_0016331d;
    if (CONCAT35(uStack_410,uStack_415) != 0x657069702d7473 ||
        CONCAT53(uStack_415,local_418) != 0x69702d7473657400) goto LAB_00163322;
    uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    loop = (uv_pipe_t *)(ulong)__fd;
    close(__fd);
    if (pipe_close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = (uv_pipe_t *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016332c;
    }
  }
  run_test_pipe_getsockname_abstract_cold_6();
LAB_0016332c:
  run_test_pipe_getsockname_abstract_cold_7();
  if (loop == &pipe_server || loop == &pipe_client) {
    pipe_close_cb_called = pipe_close_cb_called + 1;
    return (int)CONCAT71(0x3288,loop == &pipe_client);
  }
  pipe_close_cb_cold_1();
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_pipe_getsockname_blocking_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_getsockname_abstract) {
#if defined(__linux__)
  char buf[1024];
  size_t len;
  int r;
  int sock;
  struct sockaddr_un sun;
  socklen_t sun_len;
  char abstract_pipe[] = "\0test-pipe";

  sock = socket(AF_UNIX, SOCK_STREAM, 0);
  ASSERT(sock != -1);

  sun_len = sizeof sun;
  memset(&sun, 0, sun_len);
  sun.sun_family = AF_UNIX;
  memcpy(sun.sun_path, abstract_pipe, sizeof abstract_pipe);

  r = bind(sock, (struct sockaddr*)&sun, sun_len);
  ASSERT(r == 0);

  r = uv_pipe_init(uv_default_loop(), &pipe_server, 0);
  ASSERT(r == 0);
  r = uv_pipe_open(&pipe_server, sock);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_server, buf, &len);
  ASSERT(r == 0);

  ASSERT(memcmp(buf, abstract_pipe, sizeof abstract_pipe) == 0);

  uv_close((uv_handle_t*)&pipe_server, pipe_close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  close(sock);

  ASSERT(pipe_close_cb_called == 1);
  MAKE_VALGRIND_HAPPY();
  return 0;
#else
  MAKE_VALGRIND_HAPPY();
  return 0;
#endif
}